

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_support_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *needs_support)

{
  REF_GEOM pRVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  REF_BOOL has_id;
  REF_BOOL *local_50;
  ulong local_48;
  ulong local_40;
  REF_GRID local_38;
  
  pRVar1 = ref_grid->geom;
  *needs_support = 0;
  local_40 = 0xffffffff;
  iVar6 = -1;
  if (-1 < node0) {
    pRVar2 = pRVar1->ref_adj;
    local_40 = 0xffffffff;
    iVar6 = -1;
    if (node0 < pRVar2->nnode) {
      uVar5 = pRVar2->first[(uint)node0];
      local_40 = 0xffffffff;
      iVar6 = -1;
      if ((long)(int)uVar5 != -1) {
        iVar6 = pRVar2->item[(int)uVar5].ref;
        local_40 = (ulong)uVar5;
      }
    }
  }
  local_48 = (ulong)(uint)node1;
  local_50 = needs_support;
  local_38 = ref_grid;
  do {
    if ((int)local_40 == -1) {
      return 0;
    }
    uVar8 = 0xffffffff;
    iVar7 = -1;
    if (-1 < node1) {
      pRVar2 = pRVar1->ref_adj;
      uVar8 = 0xffffffff;
      iVar7 = -1;
      if (node1 < pRVar2->nnode) {
        uVar5 = pRVar2->first[local_48];
        uVar8 = 0xffffffff;
        iVar7 = -1;
        if ((long)(int)uVar5 != -1) {
          iVar7 = pRVar2->item[(int)uVar5].ref;
          uVar8 = (ulong)uVar5;
        }
      }
    }
    while ((int)uVar8 != -1) {
      pRVar3 = pRVar1->descr;
      if (((pRVar3[iVar6 * 6] == 2) && (pRVar3[iVar7 * 6] == 2)) &&
         (pRVar3[iVar6 * 6 + 1] == pRVar3[(int)(iVar7 * 6 | 1)])) {
        uVar5 = ref_cell_side_has_id(local_38->cell[3],node0,node1,pRVar3[iVar6 * 6 + 1],&has_id);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x5b2,"ref_geom_support_between",(ulong)uVar5,"has edge id");
          return uVar5;
        }
        if (has_id != 0) {
          *local_50 = 1;
          return 0;
        }
      }
      pRVar4 = pRVar1->ref_adj->item;
      uVar8 = (ulong)pRVar4[(int)uVar8].next;
      iVar7 = -1;
      if (uVar8 != 0xffffffffffffffff) {
        iVar7 = pRVar4[uVar8].ref;
      }
    }
    pRVar4 = pRVar1->ref_adj->item;
    local_40 = (ulong)pRVar4[(int)local_40].next;
    iVar6 = -1;
    if (local_40 != 0xffffffffffffffff) {
      iVar6 = pRVar4[local_40].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_support_between(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1,
                                            REF_BOOL *needs_support) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item0, item1;
  REF_INT geom0, geom1;
  REF_INT type, id;
  REF_BOOL has_id;

  *needs_support = REF_FALSE;
  /* assume face check is sufficient */
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node0, item0, geom0)
      each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node1, item1,
                                      geom1) {
    type = REF_GEOM_FACE;
    if (ref_geom_type(ref_geom, geom0) == type &&
        ref_geom_type(ref_geom, geom1) == type &&
        ref_geom_id(ref_geom, geom0) == ref_geom_id(ref_geom, geom1)) {
      id = ref_geom_id(ref_geom, geom0);
      RSS(ref_cell_side_has_id(ref_grid_tri(ref_grid), node0, node1, id,
                               &has_id),
          "has edge id");
      if (has_id) {
        *needs_support = REF_TRUE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}